

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O1

void __thiscall
MethodProperty_GetOperator_Test::~MethodProperty_GetOperator_Test
          (MethodProperty_GetOperator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, GetOperator)
{
  BasicMethodProperties obj;
  
  EXPECT_EQ( 0, obj.ro_int_value() );
  EXPECT_EQ( 0, obj.ro_int_value2() );
  EXPECT_EQ( 0, obj.int_value() );
  EXPECT_EQ( 0, obj.int_value2() );
  EXPECT_EQ( 0, obj.int_value3() );
  EXPECT_EQ( "", obj.ro_string_value() );
  EXPECT_EQ( "", obj.ro_string_value2() );
  EXPECT_EQ( "", obj.string_value() );
  EXPECT_EQ( "", obj.string_value2() );
  EXPECT_EQ( "", obj.string_value3() );

  obj.getIntValueTest() = 86;
  obj.getStringValueTest() = "bob";
  obj.getIntValue2Test() = 34;
  obj.getStringValue2Test() = "bill";
  
  EXPECT_EQ( 86, obj.ro_int_value() );
  EXPECT_EQ( 86, obj.ro_int_value2() );
  EXPECT_EQ( 34, obj.int_value() );
  EXPECT_EQ( 34, obj.int_value2() );
  EXPECT_EQ( 34, obj.int_value3() );
  EXPECT_EQ( "bob", obj.ro_string_value() );
  EXPECT_EQ( "bob", obj.ro_string_value2() );
  EXPECT_EQ( "bill", obj.string_value() );
  EXPECT_EQ( "bill", obj.string_value2() );
  EXPECT_EQ( "bill", obj.string_value3() );
}